

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sleeplock.cpp
# Opt level: O2

bool __thiscall
ON_SleepLock::GetLock
          (ON_SleepLock *this,uint interval_wait_msecs,uint max_wait_msecs,
          bool bStealLockAfterWaiting)

{
  __atomic_flag_data_type _Var1;
  uint uVar2;
  ulong uVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  LOCK();
  _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
  (this->m_lockedX).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 != false) {
    uVar3 = 0x32;
    if (interval_wait_msecs != 0) {
      uVar3 = (ulong)interval_wait_msecs;
    }
    while( true ) {
      uVar2 = max_wait_msecs;
      local_30.__r = uVar3;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
      LOCK();
      _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
      (this->m_lockedX).super___atomic_flag_base._M_i = true;
      UNLOCK();
      if (_Var1 == false) break;
      max_wait_msecs = 0;
      if (uVar2 != 0) {
        if (uVar2 <= (uint)uVar3) {
          if (bStealLockAfterWaiting) {
            ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_sleeplock.cpp"
                         ,0x9b,"","Stealing a resource lock.");
            LOCK();
            (this->m_lockedX).super___atomic_flag_base._M_i = true;
            UNLOCK();
            return true;
          }
          return false;
        }
        max_wait_msecs = uVar2 - (uint)uVar3;
      }
    }
  }
  return true;
}

Assistant:

bool ON_SleepLock::GetLock( 
  unsigned int interval_wait_msecs,
  unsigned int max_wait_msecs,
  bool bStealLockAfterWaiting
  )
{
  // int locked = ON_IntSleepLock_Test(m_locked,0,1)
  // performs the following test and assignment in
  // an atomic operation.
  //
  // int locked = m_locked;
  // if ( 0 == locked )
  //   m_locked = 1;
  if ( GetLockOrReturnFalse() )
    return true; // acquired lock

  if ( interval_wait_msecs <= 0 )
    interval_wait_msecs = ON_SleepLock::DefaultWaitInterval;

  for(;;)
  {
    // Something else currently has this lock.

    // ON_PointerSleepLock_SuspendThisThread() suspends the thread
    // (not the process) for the specified number of milliseconds.
#if defined(ON_SLEEPLOCK_USES_STD_ATOMIC_FLAG)
    std::this_thread::sleep_for(std::chrono::milliseconds(interval_wait_msecs));
#else
    // Windows - sleep the thread (not the process)
    ::Sleep(interval_wait_msecs);
#endif

    // locked = ON_IntSleepLock_Test(m_locked,0,1)
    // performs the following test and assignment in
    // an atomic operation.
    //
    // locked = m_locked;
    // if ( 0 == locked )
    //   m_locked = 1;
    if ( GetLockOrReturnFalse() )
      return true; // acquired lock
    
    if ( max_wait_msecs > 0 )
    {
      if ( interval_wait_msecs >= max_wait_msecs )
      {
        if (bStealLockAfterWaiting)
        {
          // If the caller set max_wait_msecs to a value that is too small, 
          // has a bug in their code, then this is a bad idea, 
          // but it's also their own fault.
          //
          // If the resource is locked because another thread locked it and 
          // then forgot to unlock it or terminated before it could be unlocked,
          // then this is a good thing because it gets this thread unblocked 
          // and back in business.
          //
          ON_WARNING("Stealing a resource lock.");
          GetLockOrReturnFalse();
          return true;
        }

        // Give up and return false.
        break;
      }
      max_wait_msecs -= interval_wait_msecs;
    }
  }

  return false;  
}